

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::checkSIprefix(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  char *pcVar2;
  char p;
  bool bVar3;
  ulong uVar4;
  precise_unit pVar5;
  double local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  string local_88;
  string local_68;
  string local_48;
  
  uVar4 = unit_string->_M_string_length;
  if (uVar4 < 3) {
LAB_0015951f:
    if (1 < uVar4) {
LAB_00159529:
      bVar3 = false;
      goto LAB_0015952b;
    }
    goto LAB_001598a3;
  }
  pcVar2 = (unit_string->_M_dataplus)._M_p;
  cVar1 = pcVar2[1];
  bVar3 = true;
  if (cVar1 != 'A') {
    local_b8 = getPrefixMultiplier2Char(*pcVar2,cVar1);
    if ((local_b8 != 0.0) || (NAN(local_b8))) {
      std::__cxx11::string::substr((ulong)&ustring,(ulong)unit_string);
      if (ustring._M_string_length == 1) {
        cVar1 = *ustring._M_dataplus._M_p;
        if (cVar1 == 'k') {
          local_b8 = NAN;
          uVar4 = 0xfa94a488;
        }
        else {
          uVar4 = 0x4000000;
          if (cVar1 != 'b') {
            if (cVar1 != 'B') goto LAB_001594c2;
            local_b8 = local_b8 * 8.0;
          }
        }
        std::__cxx11::string::~string((string *)&ustring);
        goto LAB_001598ab;
      }
LAB_001594c2:
      std::__cxx11::string::string((string *)&local_48,(string *)&ustring);
      pVar5 = unit_quick_match(&local_48,match_flags);
      uVar4 = pVar5._8_8_;
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&ustring);
      if ((uVar4 & 0xffffffff) != 0xfa94a488 || !NAN(pVar5.multiplier_)) {
        local_b8 = local_b8 * pVar5.multiplier_;
        goto LAB_001598ab;
      }
      uVar4 = unit_string->_M_string_length;
      goto LAB_0015951f;
    }
    goto LAB_00159529;
  }
LAB_0015952b:
  cVar1 = *(unit_string->_M_dataplus)._M_p;
  p = 'n';
  if (cVar1 != 'N') {
    p = cVar1;
  }
  if (((uint)match_flags >> 9 & 1) == 0) {
    p = cVar1;
  }
  if (((uint)match_flags >> 8 & 1) == 0) {
    local_b8 = getPrefixMultiplier(p);
    if ((local_b8 != 0.0) || (NAN(local_b8))) goto LAB_001596d2;
    goto switchD_00159588_caseD_46;
  }
  switch(p) {
  case 'E':
    local_b8 = 1e+18;
    break;
  case 'F':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'N':
  case 'O':
  case 'S':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case '[':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'b':
  case 'e':
  case 'g':
  case 'i':
  case 'j':
  case 'l':
  case 'o':
  case 's':
  case 't':
  case 'v':
  case 'w':
  case 'x':
    goto switchD_00159588_caseD_46;
  case 'G':
    local_b8 = 1000000000.0;
    break;
  case 'M':
    local_b8 = 1000000.0;
    break;
  case 'P':
    local_b8 = 1e+15;
    break;
  case 'Q':
    local_b8 = 1e+30;
    break;
  case 'R':
    local_b8 = 1e+27;
    break;
  case 'T':
    local_b8 = 1000000000000.0;
    break;
  case 'Y':
    local_b8 = 1e+24;
    break;
  case 'Z':
    local_b8 = 1e+21;
    break;
  case 'a':
    local_b8 = 1e-18;
    break;
  case 'c':
    local_b8 = 0.01;
    break;
  case 'd':
    local_b8 = 0.1;
    break;
  case 'f':
    local_b8 = 1e-15;
    break;
  case 'h':
    local_b8 = 100.0;
    break;
  case 'k':
    local_b8 = 1000.0;
    break;
  case 'm':
    local_b8 = 0.001;
    break;
  case 'n':
    local_b8 = 1e-09;
    break;
  case 'p':
    local_b8 = 1e-12;
    break;
  case 'q':
    local_b8 = 1e-30;
    break;
  case 'r':
    local_b8 = 1e-27;
    break;
  case 'u':
switchD_00159588_caseD_75:
    local_b8 = 1e-06;
    break;
  case 'y':
    local_b8 = 1e-24;
    break;
  case 'z':
    local_b8 = 1e-21;
    break;
  default:
    if (p == -0x4b) goto switchD_00159588_caseD_75;
    goto switchD_00159588_caseD_46;
  }
LAB_001596d2:
  std::__cxx11::string::substr((ulong)&ustring,(ulong)unit_string);
  if (ustring._M_string_length == 1) {
    cVar1 = *ustring._M_dataplus._M_p;
    if (cVar1 == 'k') {
      local_b8 = NAN;
      uVar4 = 0xfa94a488;
    }
    else {
      if (cVar1 != 'b') {
        if (cVar1 != 'B') goto LAB_00159727;
        local_b8 = local_b8 * 8.0;
      }
      uVar4 = 0x4000000;
    }
    std::__cxx11::string::~string((string *)&ustring);
    goto LAB_001598ab;
  }
LAB_00159727:
  std::__cxx11::string::string((string *)&local_68,(string *)&ustring);
  pVar5 = unit_quick_match(&local_68,match_flags);
  uVar4 = pVar5._8_8_;
  std::__cxx11::string::~string((string *)&local_68);
  if ((uVar4 & 0xffffffff) != 0xfa94a488 && !NAN(pVar5.multiplier_)) {
    local_b8 = local_b8 * pVar5.multiplier_;
    std::__cxx11::string::~string((string *)&ustring);
    goto LAB_001598ab;
  }
  std::__cxx11::string::~string((string *)&ustring);
switchD_00159588_caseD_46:
  if (bVar3) {
    pcVar2 = (unit_string->_M_dataplus)._M_p;
    local_b8 = getPrefixMultiplier2Char(*pcVar2,pcVar2[1]);
    if ((local_b8 != 0.0) || (NAN(local_b8))) {
      std::__cxx11::string::substr((ulong)&ustring,(ulong)unit_string);
      bVar3 = std::operator==(&ustring,"B");
      if (bVar3) {
        local_b8 = local_b8 * 8.0;
      }
      else {
        bVar3 = std::operator==(&ustring,"b");
        if (!bVar3) {
          std::__cxx11::string::string((string *)&local_88,(string *)&ustring);
          pVar5 = unit_quick_match(&local_88,match_flags);
          uVar4 = pVar5._8_8_;
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&ustring);
          if (!NAN(pVar5.multiplier_) || (uVar4 & 0xffffffff) != 0xfa94a488) {
            local_b8 = local_b8 * pVar5.multiplier_;
            goto LAB_001598ab;
          }
          goto LAB_001598a3;
        }
      }
      std::__cxx11::string::~string((string *)&ustring);
      uVar4 = 0x4000000;
      goto LAB_001598ab;
    }
  }
LAB_001598a3:
  local_b8 = NAN;
  uVar4 = 0xfa94a488;
LAB_001598ab:
  pVar5.base_units_ = (unit_data)(int)uVar4;
  pVar5.commodity_ = (int)(uVar4 >> 0x20);
  pVar5.multiplier_ = local_b8;
  return pVar5;
}

Assistant:

static precise_unit
    checkSIprefix(const std::string& unit_string, std::uint64_t match_flags)
{
    bool threeAgain{false};
    if (unit_string.size() >= 3) {
        if (unit_string[1] == 'A') {
            threeAgain = true;
        } else {
            auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
            if (mux != 0.0) {
                auto ustring = unit_string.substr(2);
                if (ustring.size() == 1) {
                    switch (ustring.front()) {
                        case 'B':
                            return {mux, precise::data::byte};
                        case 'b':
                            return {mux, precise::data::bit};
                        case 'k':
                            return precise::invalid;
                        default:
                            break;
                    }
                }

                auto retunit = unit_quick_match(ustring, match_flags);
                if (is_valid(retunit)) {
                    return {mux, retunit};
                }
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto c = unit_string.front();
        if (c == 'N' && ((match_flags & case_insensitive) != 0)) {
            c = 'n';
        }
        auto mux = ((match_flags & strict_si) == 0) ?
            getPrefixMultiplier(c) :
            getStrictSIPrefixMultiplier(c);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(1);
            if (ustring.size() == 1) {
                switch (ustring.front()) {
                    case 'B':
                        return {mux, precise::data::byte};
                    case 'b':
                        return {mux, precise::data::bit};
                    case 'k':
                        return precise::invalid;
                    default:
                        break;
                }
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return {mux, retunit};
            }
        }
    }
    if (threeAgain) {
        auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(2);
            if (ustring == "B") {
                return {mux, precise::data::byte};
            }
            if (ustring == "b") {
                return {mux, precise::data::bit};
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (is_valid(retunit)) {
                return {mux, retunit};
            }
        }
    }
    return precise::invalid;
}